

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O3

void __thiscall QPDFAcroFormDocumentHelper::invalidateCache(QPDFAcroFormDocumentHelper *this)

{
  element_type *peVar1;
  
  peVar1 = (this->m).
           super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->cache_valid = false;
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>,_std::_Select1st<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::vector<QPDFAnnotationObjectHelper,_std::allocator<QPDFAnnotationObjectHelper>_>_>_>_>
  ::clear(&(peVar1->field_to_annotations)._M_t);
  std::
  _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFFormFieldObjectHelper>_>_>
  ::clear(&(((this->m).
             super___shared_ptr<QPDFAcroFormDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->annotation_to_field)._M_t);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::invalidateCache()
{
    m->cache_valid = false;
    m->field_to_annotations.clear();
    m->annotation_to_field.clear();
}